

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

Var __thiscall Js::RecyclableObjectAddress::GetValue(RecyclableObjectAddress *this,BOOL fUpdated)

{
  ScriptContext *requestContext;
  undefined8 uVar1;
  bool bVar2;
  BOOL BVar3;
  RecyclableObject *instance;
  Var pvVar4;
  undefined1 local_38 [8];
  TTModeStackAutoPopper suppressModeAutoPopper;
  Var objValue;
  
  if (fUpdated == 0) {
    pvVar4 = this->value;
  }
  else {
    bVar2 = VarIs<Js::RecyclableObject>(this->parentObj);
    if (bVar2) {
      instance = VarTo<Js::RecyclableObject>(this->parentObj);
      requestContext =
           (((((instance->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
      suppressModeAutoPopper.m_popMode = Invalid;
      suppressModeAutoPopper._12_4_ = 0;
      local_38 = (undefined1  [8])requestContext->threadContext->TTDLog;
      suppressModeAutoPopper.m_log._0_4_ = 0;
      if (local_38 != (undefined1  [8])0x0) {
        TTD::EventLog::PushMode((EventLog *)local_38,DebuggerSuppressGetter);
        suppressModeAutoPopper.m_log._0_4_ = 0x200;
      }
      BVar3 = JavascriptOperators::GetProperty
                        (instance,this->propId,(Var *)&suppressModeAutoPopper.m_popMode,
                         requestContext,(PropertyValueInfo *)0x0);
      uVar1 = suppressModeAutoPopper._8_8_;
      TTD::TTModeStackAutoPopper::~TTModeStackAutoPopper((TTModeStackAutoPopper *)local_38);
      if (BVar3 != 0) {
        return (Var)uVar1;
      }
    }
    pvVar4 = (Var)0x0;
  }
  return pvVar4;
}

Assistant:

Var RecyclableObjectAddress::GetValue(BOOL fUpdated)
    {
        if (!fUpdated)
        {
            return value;
        }

        if (Js::VarIs<Js::RecyclableObject>(parentObj))
        {
            Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(parentObj);

            ScriptContext* requestContext = obj->GetScriptContext();
            Var objValue = nullptr;

#if ENABLE_TTD
            TTD::TTModeStackAutoPopper suppressModeAutoPopper(requestContext->GetThreadContext()->TTDLog);
            if(requestContext->GetThreadContext()->IsRuntimeInTTDMode())
            {
                suppressModeAutoPopper.PushModeAndSetToAutoPop(TTD::TTDMode::DebuggerSuppressGetter);
            }
#endif

            if (Js::JavascriptOperators::GetProperty(obj, propId, &objValue, requestContext))
            {
                return objValue;
            }
        }

        return nullptr;
    }